

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  uint uVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  short sVar11;
  uint uVar12;
  ushort uVar13;
  uint16_t uVar14;
  uint uVar15;
  
  uVar4 = CONCAT62(in_register_00000012,Radius);
  iVar2 = (int)uVar4 * -2 + 3;
  iVar10 = 6;
  sVar11 = 0;
  uVar5 = 0;
  uVar6 = gstI80DevInfo.usPanelW;
  uVar14 = gstI80DevInfo.usPanelH;
  do {
    uVar15 = Xpos + uVar5;
    iVar3 = (int)uVar4;
    uVar7 = (uint)Ypos - iVar3;
    if (((ushort)uVar15 < uVar6) && ((ushort)uVar7 < uVar14)) {
      gpFrameBuf[(ulong)(uVar15 & 0xffff) + (ulong)uVar6 * (ulong)(uVar7 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    uVar13 = Xpos + sVar11;
    if ((uVar13 < uVar6) && ((ushort)uVar7 < uVar14)) {
      gpFrameBuf[(ulong)uVar13 + (ulong)uVar6 * (ulong)(uVar7 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    uVar7 = iVar3 + (uint)Xpos;
    uVar1 = Ypos + sVar11;
    if (((ushort)uVar7 < uVar6) && (uVar1 < uVar14)) {
      gpFrameBuf[(ulong)(uVar7 & 0xffff) + (ulong)uVar6 * (ulong)uVar1] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    uVar12 = (uint)Xpos - iVar3;
    if (((ushort)uVar12 < uVar6) && (uVar1 < uVar14)) {
      gpFrameBuf[(ulong)(uVar12 & 0xffff) + (ulong)uVar6 * (ulong)uVar1] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    uVar8 = iVar3 + (uint)Ypos;
    if (((ushort)uVar15 < uVar6) && ((ushort)uVar8 < uVar14)) {
      gpFrameBuf[(ulong)(uVar15 & 0xffff) + (ulong)uVar6 * (ulong)(uVar8 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    if ((uVar13 < uVar6) && ((ushort)uVar8 < uVar14)) {
      gpFrameBuf[(ulong)uVar13 + (ulong)uVar6 * (ulong)(uVar8 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    uVar15 = Ypos + uVar5;
    if (((ushort)uVar7 < uVar6) && ((ushort)uVar15 < uVar14)) {
      gpFrameBuf[(ulong)(uVar7 & 0xffff) + (ulong)uVar6 * ((ulong)uVar15 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    if (((ushort)uVar12 < uVar6) && ((ushort)uVar15 < uVar14)) {
      gpFrameBuf[(ulong)(uVar12 & 0xffff) + (ulong)uVar6 * ((ulong)uVar15 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar14 = gstI80DevInfo.usPanelH;
    }
    iVar9 = iVar10;
    if (-1 < iVar2) {
      uVar4 = (ulong)(iVar3 - 1);
      iVar9 = (uVar5 - iVar3) * 4 + 10;
    }
    iVar2 = iVar2 + iVar9;
    uVar5 = uVar5 + 1;
    iVar10 = iVar10 + 4;
    sVar11 = sVar11 + -1;
  } while (uVar5 <= (uint)uVar4);
  return;
}

Assistant:

void EPD_DrawCircle(uint16_t Xpos,uint16_t Ypos,uint16_t Radius,uint8_t color)
{
	  int   decision;    	/* Decision Variable */ 
	  uint32_t  current_x;   	/* Current X Value */
	  uint32_t  current_y;   	/* Current Y Value */
	  
	  decision = 3 - (Radius << 1);
	  current_x = 0;
	  current_y = Radius;
	  
	  while (current_x <= current_y)
	  {
		    EPD_DrawPixel((Xpos + current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos - current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos - current_x), color);
		    
		    EPD_DrawPixel((Xpos + current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos - current_x), (Ypos + current_y), color);
		    
		    EPD_DrawPixel((Xpos + current_y), (Ypos + current_x), color);
		    
		    EPD_DrawPixel((Xpos - current_y), (Ypos + current_x), color);
		    
		    if (decision < 0)
		    { 
				decision += (current_x << 2) + 6;
		    }
		    else
		    {
			      decision += ((current_x - current_y) << 2) + 10;
			      current_y--;
		    }
		    current_x++;
	  } 
}